

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_recalculate_mpr(void)

{
  _Bool _Var1;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_domain *domain;
  
  for (__tempptr = _domain_list.next + -0x2a; __tempptr[0x2a].prev != _domain_list.prev;
      __tempptr = __tempptr[0x2a].next + -0x2a) {
    if (((ulong)__tempptr[3].prev & 1) != 0) {
      _Var1 = _recalculate_routing_mpr_set((nhdp_domain *)__tempptr);
      if (_Var1) {
        (*(code *)(__tempptr[2].prev)->prev)(__tempptr);
        _fire_mpr_changed((nhdp_domain *)__tempptr);
      }
      *(undefined1 *)&__tempptr[3].prev = 0;
    }
  }
  if ((_flooding_domain._mpr_outdated & 1U) != 0) {
    _Var1 = _recalculate_flooding_mpr_set();
    if (_Var1) {
      (*(_flooding_domain.mpr)->update_flooding_mpr)(&_flooding_domain);
      _fire_mpr_changed(&_flooding_domain);
    }
    _flooding_domain._mpr_outdated = false;
  }
  return;
}

Assistant:

void
nhdp_domain_recalculate_mpr(void) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->_mpr_outdated) {
      if (_recalculate_routing_mpr_set(domain)) {
        domain->mpr->update_routing_mpr(domain);
        _fire_mpr_changed(domain);
      }
      domain->_mpr_outdated = false;
    }
  }
  if (_flooding_domain._mpr_outdated) {
    if (_recalculate_flooding_mpr_set()) {
      _flooding_domain.mpr->update_flooding_mpr(&_flooding_domain);
      _fire_mpr_changed(&_flooding_domain);
    }
    _flooding_domain._mpr_outdated = false;
  }
}